

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O0

void __thiscall
stringCleanup_withCommodities_Test::~stringCleanup_withCommodities_Test
          (stringCleanup_withCommodities_Test *this)

{
  stringCleanup_withCommodities_Test *this_local;
  
  ~stringCleanup_withCommodities_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(stringCleanup, withCommodities)
{
    auto res = detail::testing::testCleanUpString("m^2", commodities::aluminum);
    EXPECT_EQ(res, "m{aluminum}^2");

    res = detail::testing::testCleanUpString("m^-2", commodities::aluminum);
    EXPECT_EQ(res, "{aluminum}*m^-2");

    res = detail::testing::testCleanUpString("1/m^2", ~commodities::aluminum);
    EXPECT_EQ(res, "1/m{aluminum}^2");
}